

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
::
RedefineVariable<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
          (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,int res_var,
          CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
          *fc)

{
  ConInfo *pCVar1;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
  *pck;
  FunctionalConstraint *in_RDX;
  int in_ESI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  ConInfo ci;
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
  *ck;
  int i;
  ConInfo ci_old;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  int var;
  NodeIndexRange in_stack_ffffffffffffff50;
  BasicConstraintKeeper *in_stack_ffffffffffffff68;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffff70;
  undefined1 local_70 [48];
  NodeRange local_40;
  int local_2c;
  BasicConstraintKeeper *local_28;
  undefined8 local_20;
  FunctionalConstraint *local_18;
  int local_c;
  
  var = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_18 = in_RDX;
  local_c = in_ESI;
  pCVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ::GetInitExpression((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                               in_stack_ffffffffffffff3c);
  local_28 = pCVar1->pck_;
  local_20 = *(undefined8 *)&pCVar1->index_;
  FunctionalConstraint::SetResultVar(local_18,local_c);
  local_2c = MapFind<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
                       ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                         *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (local_2c < 0) {
    var = (int)((ulong)local_70 >> 0x20);
    CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
    ::CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_40 = AddConstraint<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::ExpId>>
                         (in_stack_ffffffffffffff70,
                          (CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                           *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff50 = local_40.ir_;
    in_stack_ffffffffffffff44 = pre::NodeRange::operator_cast_to_int((NodeRange *)0x2f7a22);
    local_2c = in_stack_ffffffffffffff44;
    CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
    ::~CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>
                *)0x2f7a3d);
  }
  pck = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
        ::GetConstraintKeeper(in_RDI,(ExpConstraint *)0x0);
  ConstraintLocationHelper<mp::BasicConstraintKeeper>::ConstraintLocationHelper
            ((ConstraintLocationHelper<mp::BasicConstraintKeeper> *)&stack0xffffffffffffff68,
             &pck->super_BasicConstraintKeeper,local_2c);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::ReplaceInitExpression
            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)in_stack_ffffffffffffff50,var,
             (ConInfo *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::MarkAsBridged((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                   *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                  (ConInfo *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  return;
}

Assistant:

void RedefineVariable(int res_var, FuncConstraint&& fc) {
    assert( MPD( HasInitExpression(res_var) ) );
		auto ci_old = MPD( GetInitExpression(res_var) );
    fc.SetResultVar(res_var);
		// If this expression exists, use it.
		// TODO make sure any new context is re-converted
		// if necessary.
		auto i = MPD( MapFind(fc) );
    // TODO preprocess, try map again, and use the result.
		if (i<0)
      i = int( MPD( AddConstraint(std::move(fc)) ) );
		auto& ck = GET_CONSTRAINT_KEEPER( FuncConstraint );
    ConInfo ci{&ck, i};
    ReplaceInitExpression(res_var, ci);
    MarkAsBridged(ci_old);
  }